

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list.h
# Opt level: O2

LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> * __thiscall
data_structures::LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::clear
          (LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *this)

{
  while (this->_header != this->_tail) {
    deleteFromHeader(this);
  }
  this->_size = 0;
  return this;
}

Assistant:

inline
    LinkedList<T>* LinkedList<T>::clear(){
        while (!isEmpty()) {
            deleteFromHeader();
        }
        _tail = _header;
        _size = 0;
        return this;
    }